

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::forward_int8_x86
          (ConvolutionDepthWise_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  Layer *pLVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int *piVar15;
  int iVar16;
  undefined1 uVar17;
  int iVar18;
  uint uVar19;
  _func_int **pp_Var20;
  _func_int *p_Var21;
  long lVar22;
  undefined4 *puVar23;
  ulong uVar24;
  void *pvVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  int g;
  uint uVar29;
  undefined8 *puVar30;
  void *pvVar31;
  int iVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  undefined1 *puVar35;
  int iVar36;
  void *pvVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  int remain_1;
  int iVar41;
  long lVar42;
  int k;
  uint uVar43;
  ulong uVar44;
  float *pfVar45;
  int iVar46;
  size_t sVar47;
  uint uVar48;
  int g_1;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  void *pvVar52;
  bool bVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  __m128 pos;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  __m128 pos_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  __m128 max;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  byte local_318;
  int local_308;
  Mat scales;
  int local_288;
  Mat top_blob_unpacked;
  int local_208;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> requantize_scales;
  _Vector_base<float,_std::allocator<float>_> local_160;
  _Vector_base<float,_std::allocator<float>_> local_148;
  _Vector_base<float,_std::allocator<float>_> local_130;
  _Vector_base<float,_std::allocator<float>_> local_118;
  Mat bottom_blob_int8;
  Option opt_g;
  Mat top_blob_g;
  
  iVar46 = bottom_blob->elempack;
  iVar36 = bottom_blob->c;
  if (iVar46 == 0) {
    bVar53 = false;
  }
  else {
    bVar53 = ((int)bottom_blob->elemsize << 3) / iVar46 == 8;
  }
  p_Var21 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var21);
  iVar18 = *(int *)(&this->field_0xdc + (long)p_Var21);
  iVar41 = *(int *)(&this->field_0xd8 + (long)p_Var21);
  iVar26 = *(int *)(&this->field_0xe0 + (long)p_Var21);
  Mat::Mat(&bottom_blob_int8,bottom_blob);
  auVar111 = in_ZMM8._0_16_;
  auVar130 = in_ZMM4._0_16_;
  if (!bVar53) {
    iVar46 = iVar46 * iVar36;
    iVar36 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
    lVar49 = 0;
    Mat::Mat(&scales,iVar46,4,(Allocator *)0x0);
    iVar46 = iVar46 / iVar36;
    pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
    puVar23 = (undefined4 *)scales.data;
    if (iVar46 < 1) {
      iVar46 = 0;
    }
    for (; lVar49 < *(int *)(&this->field_0x108 + (long)pp_Var20[-3]); lVar49 = lVar49 + 1) {
      uVar4 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)pp_Var20[-3]) + lVar49 * 4);
      iVar36 = iVar46;
      while (bVar53 = iVar36 != 0, iVar36 = iVar36 + -1, bVar53) {
        *puVar23 = uVar4;
        puVar23 = puVar23 + 1;
      }
    }
    top_blob_unpacked.data = *(void **)opt;
    top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
    top_blob_unpacked.elempack = opt->openmp_blocktime;
    top_blob_unpacked._28_1_ = opt->use_winograd_convolution;
    top_blob_unpacked._29_1_ = opt->use_sgemm_convolution;
    top_blob_unpacked._30_1_ = opt->use_int8_inference;
    top_blob_unpacked._31_1_ = opt->use_vulkan_compute;
    top_blob_unpacked.allocator._0_1_ = opt->use_bf16_storage;
    top_blob_unpacked.allocator._1_1_ = opt->use_fp16_packed;
    top_blob_unpacked.allocator._2_1_ = opt->use_fp16_storage;
    top_blob_unpacked.allocator._3_1_ = opt->use_fp16_arithmetic;
    top_blob_unpacked.allocator._4_1_ = opt->use_int8_packed;
    top_blob_unpacked.allocator._5_1_ = opt->use_int8_storage;
    top_blob_unpacked.allocator._6_1_ = opt->use_int8_arithmetic;
    top_blob_unpacked.allocator._7_1_ = opt->use_packing_layout;
    top_blob_unpacked.dims._0_1_ = opt->use_shader_pack8;
    top_blob_unpacked.dims._1_1_ = opt->use_subgroup_basic;
    top_blob_unpacked.dims._2_1_ = opt->use_subgroup_vote;
    top_blob_unpacked.dims._3_1_ = opt->use_subgroup_ballot;
    top_blob_unpacked.w._0_1_ = opt->use_subgroup_shuffle;
    top_blob_unpacked.w._1_1_ = opt->use_image_storage;
    top_blob_unpacked.w._2_1_ = opt->use_tensor_storage;
    top_blob_unpacked.w._3_1_ = opt->use_weight_fp16_storage;
    top_blob_unpacked.h = opt->flush_denormals;
    top_blob_unpacked.d._0_1_ = opt->use_local_pool_allocator;
    top_blob_unpacked.d._1_1_ = opt->use_reserved_1;
    top_blob_unpacked.d._2_1_ = opt->use_reserved_2;
    top_blob_unpacked.d._3_1_ = opt->use_reserved_3;
    top_blob_unpacked.c._0_1_ = opt->use_reserved_4;
    top_blob_unpacked.c._1_1_ = opt->use_reserved_5;
    top_blob_unpacked.c._2_1_ = opt->use_reserved_6;
    top_blob_unpacked.c._3_1_ = opt->use_reserved_7;
    top_blob_unpacked._60_1_ = opt->use_reserved_8;
    top_blob_unpacked._61_1_ = opt->use_reserved_9;
    top_blob_unpacked._62_1_ = opt->use_reserved_10;
    top_blob_unpacked._63_1_ = opt->use_reserved_11;
    top_blob_unpacked.refcount = (int *)opt->workspace_allocator;
    in_ZMM4 = ZEXT1664(auVar130);
    in_ZMM8 = ZEXT1664(auVar111);
    quantize_to_int8(bottom_blob,&bottom_blob_int8,&scales,(Option *)&top_blob_unpacked);
    Mat::~Mat(&scales);
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]),&bottom_blob_int8,
             &bottom_blob_bordered,opt);
  iVar40 = bottom_blob_bordered.c;
  iVar16 = bottom_blob_bordered.w;
  iVar36 = bottom_blob_bordered.elempack;
  iVar46 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (bottom_blob_bordered.cstep * (long)bottom_blob_bordered.c == 0)) goto LAB_002624be;
  p_Var21 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar27 = (~((iVar27 + -1) * iVar18) + bottom_blob_bordered.w) /
           *(int *)(&this->field_0xe4 + (long)p_Var21);
  iVar32 = iVar27 + 1;
  local_208 = (int)((long)(~((iVar41 + -1) * iVar26) + bottom_blob_bordered.h) /
                   (long)*(int *)(&this->field_0xe8 + (long)p_Var21));
  iVar18 = local_208 + 1;
  uVar29 = bottom_blob_bordered.elempack * bottom_blob_bordered.c;
  if ((uVar29 == *(uint *)(&this->field_0x108 + (long)p_Var21)) &&
     (uVar29 == *(uint *)(&this->field_0xd0 + (long)p_Var21))) {
    uVar43 = 8;
    if (opt->use_packing_layout == false) {
      uVar43 = 1;
    }
    if ((uVar29 & 7) != 0) {
      uVar43 = 1;
    }
    iVar41 = *(int *)(&this->field_0x10c + (long)p_Var21);
    uVar48 = uVar43 * 4;
    if (100 < iVar41) {
      uVar48 = uVar43;
    }
    Mat::create(top_blob,iVar32,iVar18,(int)uVar29 / (int)uVar43,(ulong)uVar48,uVar43,
                opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_002624be;
    iVar46 = 0;
    if (iVar36 == 1) {
      pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      p_Var21 = pp_Var20[-3];
      iVar46 = *(int *)(&this->field_0xd8 + (long)p_Var21);
      if (iVar46 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var21) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var21) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var21) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var21) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var21) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var21) < 2)))) {
          if (iVar41 < 0x65) {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (lVar49 = 0; p_Var21 = pp_Var20[-3],
                lVar49 < *(int *)(&this->field_0x108 + (long)p_Var21); lVar49 = lVar49 + 1) {
              scales.data = (void *)CONCAT44(scales.data._4_4_,
                                             1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                        (long)p_Var21) + lVar49 * 4)
                                                   * *(float *)(*(long *)(&this->field_0x240 +
                                                                         (long)p_Var21) + lVar49 * 4
                                                               )));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_130,&requantize_scales);
            lVar42 = (long)bottom_blob_bordered.w;
            iVar46 = top_blob->w;
            lVar49 = *(long *)(&this->field_0x168 + (long)p_Var21);
            uVar50 = 0;
            iVar36 = top_blob->h;
            if (top_blob->h < 1) {
              iVar36 = 0;
            }
            lVar28 = *(long *)(&this->field_0x1b0 + (long)p_Var21);
            uVar51 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar51 = uVar50;
            }
            for (; uVar50 != uVar51; uVar50 = uVar50 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar50);
              pvVar31 = scales.data;
              if (lVar28 == 0) {
                fVar55 = 0.0;
              }
              else {
                fVar55 = *(float *)(lVar28 + uVar50 * 4);
              }
              fVar54 = local_130._M_impl.super__Vector_impl_data._M_start[uVar50];
              Mat::fill(&scales,fVar55);
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar50);
              pvVar52 = top_blob_unpacked.data;
              Mat::~Mat(&top_blob_unpacked);
              lVar22 = lVar42 + (long)pvVar52;
              pvVar25 = (void *)(lVar42 * 2 + (long)pvVar52);
              for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
                lVar38 = 0;
                pvVar37 = pvVar31;
                for (iVar18 = iVar46; 0 < iVar18; iVar18 = iVar18 + -1) {
                  auVar130 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar52 + lVar38)),
                                         (uint)*(byte *)((long)pvVar52 + lVar38 + 2),2);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar22 + lVar38),3);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar22 + 1 + lVar38),4);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar22 + 2 + lVar38),5);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar25 + lVar38),6);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar25 + lVar38 + 1),7);
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = *(ulong *)(lVar49 + uVar50 * 9);
                  auVar111 = vpmovsxbw_avx(auVar1);
                  auVar130 = vpmovsxbw_avx(auVar130);
                  auVar130 = vpmaddwd_avx(auVar111,auVar130);
                  auVar130 = vphaddd_avx((undefined1  [16])0x0,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar63._0_4_ =
                       (float)(auVar130._0_4_ +
                              (int)*(char *)(lVar49 + 8 + uVar50 * 9) *
                              (int)*(char *)((long)pvVar25 + lVar38 + 2));
                  auVar63._4_12_ = in_ZMM4._4_12_;
                  auVar130 = vfmadd213ss_fma(auVar63,ZEXT416((uint)fVar54),
                                             ZEXT416(*(uint *)((long)pvVar31 + lVar38 * 4)));
                  *(int *)((long)pvVar31 + lVar38 * 4) = auVar130._0_4_;
                  pvVar37 = (void *)((long)pvVar37 + 4);
                  lVar38 = lVar38 + 1;
                }
                pvVar52 = (void *)((long)pvVar52 + lVar38 + 2);
                lVar22 = lVar22 + lVar38 + 2;
                pvVar25 = (void *)((long)pvVar25 + lVar38 + 2);
                pvVar31 = pvVar37;
              }
              Mat::~Mat(&scales);
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_130);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
          }
          else {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (lVar49 = 0; p_Var21 = pp_Var20[-3],
                lVar49 < *(int *)(&this->field_0x108 + (long)p_Var21); lVar49 = lVar49 + 1) {
              fVar55 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var21) + lVar49 * 4);
              fVar54 = 0.0;
              if (fVar55 != 0.0) {
                fVar54 = 1.0 / (fVar55 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var21) +
                                                   lVar49 * 4));
              }
              scales.data = (void *)CONCAT44(scales.data._4_4_,fVar54);
              top_blob_unpacked.data =
                   (void *)CONCAT44(top_blob_unpacked.data._4_4_,
                                    *(undefined4 *)
                                     (*(long *)(&this->field_0x288 + (long)p_Var21) + lVar49 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&top_blob_unpacked);
              pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_118,&requantize_scales);
            lVar42 = (long)bottom_blob_bordered.w;
            iVar46 = top_blob->w;
            iVar36 = top_blob->h;
            lVar49 = *(long *)(&this->field_0x168 + (long)p_Var21);
            if (iVar36 < 1) {
              iVar36 = 0;
            }
            lVar28 = *(long *)(&this->field_0x1b0 + (long)p_Var21);
            uVar51 = 0;
            uVar50 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar50 = uVar51;
            }
            for (; uVar51 != uVar50; uVar51 = uVar51 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar51);
              pvVar31 = scales.data;
              if (lVar28 == 0) {
                uVar29 = 0;
              }
              else {
                uVar29 = *(uint *)(lVar28 + uVar51 * 4);
              }
              fVar55 = local_118._M_impl.super__Vector_impl_data._M_start[uVar51 * 2];
              fVar54 = local_118._M_impl.super__Vector_impl_data._M_start[uVar51 * 2 + 1];
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar51);
              pvVar52 = top_blob_unpacked.data;
              Mat::~Mat(&top_blob_unpacked);
              lVar22 = lVar42 + (long)pvVar52;
              pvVar25 = (void *)(lVar42 * 2 + (long)pvVar52);
              auVar14._8_4_ = 0x80000000;
              auVar14._0_8_ = 0x8000000080000000;
              auVar14._12_4_ = 0x80000000;
              auVar8._8_4_ = 0x3effffff;
              auVar8._0_8_ = 0x3effffff3effffff;
              auVar8._12_4_ = 0x3effffff;
              for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
                lVar38 = 0;
                for (iVar18 = iVar46; 0 < iVar18; iVar18 = iVar18 + -1) {
                  auVar130 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar52 + lVar38)),
                                         (uint)*(byte *)((long)pvVar52 + lVar38 + 2),2);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar22 + lVar38),3);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar22 + 1 + lVar38),4);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar22 + 2 + lVar38),5);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar25 + lVar38),6);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar25 + lVar38 + 1),7);
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = *(ulong *)(lVar49 + uVar51 * 9);
                  auVar111 = vpmovsxbw_avx(auVar2);
                  auVar130 = vpmovsxbw_avx(auVar130);
                  auVar130 = vpmaddwd_avx(auVar111,auVar130);
                  auVar130 = vphaddd_avx((undefined1  [16])0x0,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar64._0_4_ =
                       (float)(auVar130._0_4_ +
                              (int)*(char *)(lVar49 + 8 + uVar51 * 9) *
                              (int)*(char *)((long)pvVar25 + lVar38 + 2));
                  auVar64._4_12_ = in_ZMM8._4_12_;
                  auVar130 = vfmadd213ss_fma(auVar64,ZEXT416((uint)fVar55),ZEXT416(uVar29));
                  fVar7 = auVar130._0_4_ * fVar54;
                  auVar130 = vandps_avx(ZEXT416((uint)fVar7),auVar14);
                  auVar130 = vorps_avx(auVar130,auVar8);
                  auVar130 = ZEXT416((uint)(fVar7 + auVar130._0_4_));
                  auVar130 = vroundss_avx(auVar130,auVar130,0xb);
                  iVar41 = (int)auVar130._0_4_;
                  if (iVar41 < -0x7e) {
                    iVar41 = -0x7f;
                  }
                  uVar17 = (undefined1)iVar41;
                  if (0x7e < iVar41) {
                    uVar17 = 0x7f;
                  }
                  *(undefined1 *)((long)pvVar31 + lVar38) = uVar17;
                  lVar38 = lVar38 + 1;
                }
                pvVar52 = (void *)((long)pvVar52 + lVar38 + 2);
                lVar22 = lVar22 + lVar38 + 2;
                pvVar25 = (void *)((long)pvVar25 + lVar38 + 2);
                pvVar31 = (void *)((long)pvVar31 + lVar38);
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_118;
LAB_0026406d:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
          }
          iVar46 = 0;
          pLVar5 = this->activation;
          if (pLVar5 != (Layer *)0x0) {
            (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
          }
          goto LAB_002624be;
        }
        iVar46 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var21) == 1) &&
             ((*(int *)(&this->field_0xe0 + (long)p_Var21) == 1 &&
              (*(int *)(&this->field_0xe4 + (long)p_Var21) == 2)))) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var21) == 2)) &&
           (*(uint *)(&this->field_0x110 + (long)p_Var21) < 2)) {
          if (iVar41 < 0x65) {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (lVar49 = 0; p_Var21 = pp_Var20[-3],
                lVar49 < *(int *)(&this->field_0x108 + (long)p_Var21); lVar49 = lVar49 + 1) {
              scales.data = (void *)CONCAT44(scales.data._4_4_,
                                             1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                        (long)p_Var21) + lVar49 * 4)
                                                   * *(float *)(*(long *)(&this->field_0x240 +
                                                                         (long)p_Var21) + lVar49 * 4
                                                               )));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_160,&requantize_scales);
            lVar28 = (long)bottom_blob_bordered.w;
            iVar46 = top_blob->w;
            lVar49 = *(long *)(&this->field_0x168 + (long)p_Var21);
            lVar42 = *(long *)(&this->field_0x1b0 + (long)p_Var21);
            uVar50 = 0;
            iVar36 = top_blob->h;
            if (top_blob->h < 1) {
              iVar36 = 0;
            }
            uVar51 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar51 = uVar50;
            }
            lVar22 = (long)((bottom_blob_bordered.w - iVar46) * 2);
            for (; uVar50 != uVar51; uVar50 = uVar50 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar50);
              pvVar31 = scales.data;
              if (lVar42 == 0) {
                fVar55 = 0.0;
              }
              else {
                fVar55 = *(float *)(lVar42 + uVar50 * 4);
              }
              fVar54 = local_160._M_impl.super__Vector_impl_data._M_start[uVar50];
              Mat::fill(&scales,fVar55);
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar50);
              pvVar52 = top_blob_unpacked.data;
              Mat::~Mat(&top_blob_unpacked);
              lVar38 = lVar28 + (long)pvVar52;
              pvVar25 = (void *)(lVar28 * 2 + (long)pvVar52);
              for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
                lVar39 = 0;
                pvVar37 = pvVar31;
                for (iVar18 = iVar46; 0 < iVar18; iVar18 = iVar18 + -1) {
                  auVar130 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar52 + lVar39)),
                                         (uint)*(byte *)((long)pvVar52 + lVar39 + 2),2);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar38 + lVar39),3);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar38 + 1 + lVar39),4);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar38 + 2 + lVar39),5);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar25 + lVar39),6);
                  auVar111 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar25 + lVar39 + 1),7);
                  auVar130._8_8_ = 0;
                  auVar130._0_8_ = *(ulong *)(lVar49 + uVar50 * 9);
                  auVar130 = vpmovsxbw_avx(auVar130);
                  auVar111 = vpmovsxbw_avx(auVar111);
                  auVar130 = vpmaddwd_avx(auVar130,auVar111);
                  auVar130 = vphaddd_avx((undefined1  [16])0x0,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar111._0_4_ =
                       (float)(auVar130._0_4_ +
                              (int)*(char *)(lVar49 + 8 + uVar50 * 9) *
                              (int)*(char *)((long)pvVar25 + lVar39 + 2));
                  auVar111._4_12_ = in_ZMM4._4_12_;
                  auVar130 = vfmadd213ss_fma(auVar111,ZEXT416((uint)fVar54),
                                             ZEXT416(*(uint *)((long)pvVar31 + lVar39 * 2)));
                  *(int *)((long)pvVar31 + lVar39 * 2) = auVar130._0_4_;
                  pvVar37 = (void *)((long)pvVar37 + 4);
                  lVar39 = lVar39 + 2;
                }
                pvVar52 = (void *)((long)pvVar52 + lVar39 + lVar22);
                lVar38 = lVar38 + lVar22 + lVar39;
                pvVar25 = (void *)((long)pvVar25 + lVar39 + lVar22);
                pvVar31 = pvVar37;
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_160;
          }
          else {
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (lVar49 = 0; p_Var21 = pp_Var20[-3],
                lVar49 < *(int *)(&this->field_0x108 + (long)p_Var21); lVar49 = lVar49 + 1) {
              fVar55 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var21) + lVar49 * 4);
              fVar54 = 0.0;
              if (fVar55 != 0.0) {
                fVar54 = 1.0 / (fVar55 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var21) +
                                                   lVar49 * 4));
              }
              scales.data = (void *)CONCAT44(scales.data._4_4_,fVar54);
              top_blob_unpacked.data =
                   (void *)CONCAT44(top_blob_unpacked.data._4_4_,
                                    *(undefined4 *)
                                     (*(long *)(&this->field_0x288 + (long)p_Var21) + lVar49 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&scales);
              std::vector<float,_std::allocator<float>_>::push_back
                        (&requantize_scales,(value_type_conflict1 *)&top_blob_unpacked);
              pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_148,&requantize_scales);
            lVar28 = (long)bottom_blob_bordered.w;
            iVar46 = top_blob->w;
            lVar49 = *(long *)(&this->field_0x168 + (long)p_Var21);
            lVar42 = *(long *)(&this->field_0x1b0 + (long)p_Var21);
            uVar50 = 0;
            iVar36 = top_blob->h;
            if (top_blob->h < 1) {
              iVar36 = 0;
            }
            uVar51 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar51 = uVar50;
            }
            lVar22 = (long)((bottom_blob_bordered.w - iVar46) * 2);
            for (; uVar50 != uVar51; uVar50 = uVar50 + 1) {
              Mat::channel(&scales,top_blob,(int)uVar50);
              puVar35 = (undefined1 *)scales.data;
              if (lVar42 == 0) {
                uVar29 = 0;
              }
              else {
                uVar29 = *(uint *)(lVar42 + uVar50 * 4);
              }
              fVar55 = local_148._M_impl.super__Vector_impl_data._M_start[uVar50 * 2];
              fVar54 = local_148._M_impl.super__Vector_impl_data._M_start[uVar50 * 2 + 1];
              Mat::channel(&top_blob_unpacked,&bottom_blob_bordered,(int)uVar50);
              pvVar31 = top_blob_unpacked.data;
              Mat::~Mat(&top_blob_unpacked);
              lVar38 = lVar28 + (long)pvVar31;
              pvVar52 = (void *)(lVar28 * 2 + (long)pvVar31);
              auVar162._8_4_ = 0x80000000;
              auVar162._0_8_ = 0x8000000080000000;
              auVar162._12_4_ = 0x80000000;
              auVar138._8_4_ = 0x3effffff;
              auVar138._0_8_ = 0x3effffff3effffff;
              auVar138._12_4_ = 0x3effffff;
              for (iVar27 = 0; iVar27 != iVar36; iVar27 = iVar27 + 1) {
                lVar39 = 0;
                for (iVar18 = iVar46; 0 < iVar18; iVar18 = iVar18 + -1) {
                  auVar130 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar31 + lVar39)),
                                         (uint)*(byte *)((long)pvVar31 + lVar39 + 2),2);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar38 + lVar39),3);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar38 + 1 + lVar39),4);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)(lVar38 + 2 + lVar39),5);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar52 + lVar39),6);
                  auVar130 = vpinsrb_avx(auVar130,(uint)*(byte *)((long)pvVar52 + lVar39 + 1),7);
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = *(ulong *)(lVar49 + uVar50 * 9);
                  auVar111 = vpmovsxbw_avx(auVar3);
                  auVar130 = vpmovsxbw_avx(auVar130);
                  auVar130 = vpmaddwd_avx(auVar111,auVar130);
                  auVar130 = vphaddd_avx((undefined1  [16])0x0,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar130 = vphaddd_avx(auVar130,auVar130);
                  auVar65._0_4_ =
                       (float)(auVar130._0_4_ +
                              (int)*(char *)(lVar49 + 8 + uVar50 * 9) *
                              (int)*(char *)((long)pvVar52 + lVar39 + 2));
                  auVar65._4_12_ = in_ZMM8._4_12_;
                  auVar130 = vfmadd213ss_fma(auVar65,ZEXT416((uint)fVar55),ZEXT416(uVar29));
                  fVar7 = auVar130._0_4_ * fVar54;
                  auVar130 = vandps_avx(ZEXT416((uint)fVar7),auVar162);
                  auVar130 = vorps_avx(auVar130,auVar138);
                  auVar130 = ZEXT416((uint)(fVar7 + auVar130._0_4_));
                  auVar130 = vroundss_avx(auVar130,auVar130,0xb);
                  iVar41 = (int)auVar130._0_4_;
                  if (iVar41 < -0x7e) {
                    iVar41 = -0x7f;
                  }
                  uVar17 = (undefined1)iVar41;
                  if (0x7e < iVar41) {
                    uVar17 = 0x7f;
                  }
                  *puVar35 = uVar17;
                  puVar35 = puVar35 + 1;
                  lVar39 = lVar39 + 2;
                }
                pvVar31 = (void *)((long)pvVar31 + lVar39 + lVar22);
                lVar38 = lVar38 + lVar22 + lVar39;
                pvVar52 = (void *)((long)pvVar52 + lVar39 + lVar22);
              }
              Mat::~Mat(&scales);
            }
            this_00 = &local_148;
          }
          goto LAB_0026406d;
        }
      }
      uVar29 = iVar46 * *(int *)(&this->field_0xd4 + (long)p_Var21);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&top_blob_unpacked,(long)(int)uVar29,
                 (allocator_type *)&scales);
      pvVar31 = top_blob_unpacked.data;
      pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      p_Var21 = pp_Var20[-3];
      iVar46 = *(int *)(&this->field_0xe0 + (long)p_Var21);
      iVar36 = *(int *)(&this->field_0xdc + (long)p_Var21);
      iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var21);
      lVar49 = 0;
      iVar26 = 0;
      for (iVar40 = 0; iVar40 < *(int *)(&this->field_0xd8 + (long)p_Var21); iVar40 = iVar40 + 1) {
        for (lVar42 = 0; (int)lVar42 < *(int *)(&this->field_0xd4 + (long)p_Var21);
            lVar42 = lVar42 + 1) {
          *(int *)((long)top_blob_unpacked.data + lVar42 * 4 + (long)(int)lVar49 * 4) = iVar26;
          p_Var21 = pp_Var20[-3];
          iVar26 = iVar26 + *(int *)(&this->field_0xdc + (long)p_Var21);
        }
        iVar26 = iVar26 + (iVar16 * iVar46 - iVar36 * iVar18);
        lVar49 = (int)lVar49 + lVar42;
      }
      lVar49 = 0;
      uVar43 = uVar29;
      if ((int)uVar29 < 1) {
        uVar43 = 0;
      }
      auVar62._8_4_ = 0x3effffff;
      auVar62._0_8_ = 0x3effffff3effffff;
      auVar62._12_4_ = 0x3effffff;
      for (lVar42 = 0; lVar42 < *(int *)(&this->field_0x108 + (long)p_Var21); lVar42 = lVar42 + 1) {
        iVar46 = (int)lVar42;
        Mat::channel(&scales,top_blob,iVar46);
        puVar35 = (undefined1 *)scales.data;
        Mat::~Mat(&scales);
        Mat::channel(&scales,top_blob,iVar46);
        pfVar45 = (float *)scales.data;
        Mat::~Mat(&scales);
        lVar28 = *(long *)(&this->field_0x168 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])
        ;
        Mat::channel(&scales,&bottom_blob_bordered,iVar46);
        for (iVar46 = 0; iVar46 <= local_208; iVar46 = iVar46 + 1) {
          pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
          for (iVar36 = 0; iVar36 <= iVar27; iVar36 = iVar36 + 1) {
            p_Var21 = pp_Var20[-3];
            iVar18 = 0;
            for (uVar50 = 0; uVar43 != uVar50; uVar50 = uVar50 + 1) {
              iVar18 = iVar18 + (int)*(char *)(lVar28 + lVar49 + uVar50) *
                                (int)*(char *)((long)scales.data +
                                              (long)*(int *)((long)pvVar31 + uVar50 * 4) +
                                              (long)iVar36 *
                                              (long)*(int *)(&this->field_0xe4 + (long)p_Var21) +
                                              (long)scales.w * (long)iVar46 *
                                              (long)*(int *)(&this->field_0xe8 + (long)p_Var21) *
                                              scales.elemsize);
            }
            fVar55 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var21) + lVar42 * 4);
            fVar54 = 0.0;
            if (fVar55 != 0.0) {
              fVar54 = 1.0 / (fVar55 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var21) +
                                                 lVar42 * 4));
            }
            fVar54 = fVar54 * (float)iVar18;
            if (*(int *)(&this->field_0x100 + (long)p_Var21) != 0) {
              fVar54 = fVar54 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var21) +
                                          lVar42 * 4);
            }
            auVar130 = ZEXT416((uint)fVar54);
            fVar55 = fVar54;
            switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var21)) {
            case 1:
              auVar130 = vmaxss_avx(auVar130,ZEXT416(0));
              fVar55 = auVar130._0_4_;
              break;
            case 2:
              auVar130 = vcmpss_avx(ZEXT816(0) << 0x40,auVar130,1);
              auVar80._8_4_ = 0x3f800000;
              auVar80._0_8_ = 0x3f8000003f800000;
              auVar80._12_4_ = 0x3f800000;
              auVar130 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var21)),
                                       auVar80,auVar130);
              fVar55 = auVar130._0_4_ * fVar54;
              break;
            case 3:
              auVar130 = vmaxss_avx(auVar130,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var21)
                                                    ));
              auVar130 = vminss_avx(auVar130,ZEXT416((*(uint **)(&this->field_0x118 + (long)p_Var21)
                                                     )[1]));
              fVar55 = auVar130._0_4_;
              break;
            case 4:
              fVar55 = expf(-fVar54);
              fVar55 = 1.0 / (fVar55 + 1.0);
              break;
            case 5:
              fVar55 = expf(fVar54);
              fVar55 = logf(fVar55 + 1.0);
              fVar55 = tanhf(fVar55);
              fVar55 = fVar55 * fVar54;
              break;
            case 6:
              fVar7 = **(float **)(&this->field_0x118 + (long)p_Var21);
              fVar6 = (*(float **)(&this->field_0x118 + (long)p_Var21))[1];
              fVar81 = -fVar6 / fVar7;
              fVar55 = 0.0;
              if ((fVar81 <= fVar54) && (fVar55 = fVar54, fVar54 <= fVar81 + 1.0 / fVar7)) {
                auVar130 = vfmadd213ss_fma(ZEXT416((uint)fVar7),auVar130,ZEXT416((uint)fVar6));
                fVar55 = auVar130._0_4_ * fVar54;
              }
            }
            if (iVar41 < 0x65) {
              *pfVar45 = fVar55;
              pfVar45 = pfVar45 + 1;
            }
            else {
              fVar55 = fVar55 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var21) +
                                          lVar42 * 4);
              auVar10._8_4_ = 0x80000000;
              auVar10._0_8_ = 0x8000000080000000;
              auVar10._12_4_ = 0x80000000;
              auVar130 = vandps_avx(ZEXT416((uint)fVar55),auVar10);
              auVar130 = vorps_avx(auVar130,auVar62);
              auVar130 = ZEXT416((uint)(fVar55 + auVar130._0_4_));
              auVar130 = vroundss_avx(auVar130,auVar130,0xb);
              iVar18 = (int)auVar130._0_4_;
              if (iVar18 < -0x7e) {
                iVar18 = -0x7f;
              }
              uVar17 = (undefined1)iVar18;
              if (0x7e < iVar18) {
                uVar17 = 0x7f;
              }
              *puVar35 = uVar17;
              puVar35 = puVar35 + 1;
            }
          }
        }
        Mat::~Mat(&scales);
        p_Var21 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
        lVar49 = lVar49 + (int)uVar29;
      }
    }
    else {
      if (iVar36 != 8) goto LAB_002624be;
      uVar50 = (long)*(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) *
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&top_blob_unpacked,uVar50,
                 (allocator_type *)&scales);
      pvVar31 = top_blob_unpacked.data;
      pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      p_Var21 = pp_Var20[-3];
      iVar46 = *(int *)(&this->field_0xe0 + (long)p_Var21);
      iVar36 = *(int *)(&this->field_0xdc + (long)p_Var21);
      iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var21);
      iVar32 = 0;
      lVar49 = 0;
      for (iVar26 = 0; iVar26 < *(int *)(&this->field_0xd8 + (long)p_Var21); iVar26 = iVar26 + 1) {
        for (lVar42 = 0; (int)lVar42 < *(int *)(&this->field_0xd4 + (long)p_Var21);
            lVar42 = lVar42 + 1) {
          *(int *)((long)top_blob_unpacked.data + lVar42 * 4 + (long)(int)lVar49 * 4) = iVar32;
          p_Var21 = pp_Var20[-3];
          iVar32 = iVar32 + *(int *)(&this->field_0xdc + (long)p_Var21);
        }
        iVar32 = iVar32 + (iVar16 * iVar46 - iVar36 * iVar18);
        lVar49 = (int)lVar49 + lVar42;
      }
      uVar51 = uVar50 & 0xffffffff;
      if ((int)uVar50 < 1) {
        uVar51 = 0;
      }
      local_288 = 0;
      uVar33 = (ulong)(uint)iVar40;
      if (iVar40 < 1) {
        uVar33 = 0;
      }
      auVar56._8_2_ = 0x7f;
      auVar56._0_8_ = 0x7f007f007f007f;
      auVar56._10_2_ = 0x7f;
      auVar56._12_2_ = 0x7f;
      auVar56._14_2_ = 0x7f;
      for (uVar24 = 0; uVar24 != uVar33; uVar24 = uVar24 + 1) {
        iVar46 = (int)uVar24;
        Mat::channel(&scales,top_blob,iVar46);
        puVar30 = (undefined8 *)scales.data;
        Mat::~Mat(&scales);
        Mat::channel(&scales,top_blob,iVar46);
        pauVar34 = (undefined1 (*) [16])scales.data;
        Mat::~Mat(&scales);
        pvVar52 = (this->weight_data_int8).data;
        Mat::channel(&scales,&bottom_blob_bordered,iVar46);
        for (iVar46 = 0; iVar46 <= local_208; iVar46 = iVar46 + 1) {
          pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx2;
          for (iVar36 = 0; iVar36 <= iVar27; iVar36 = iVar36 + 1) {
            p_Var21 = pp_Var20[-3];
            auVar66 = ZEXT1664((undefined1  [16])0x0);
            uVar44 = 0;
            auVar74 = ZEXT1664((undefined1  [16])0x0);
            while( true ) {
              if (uVar51 == uVar44) break;
              auVar75._8_8_ = 0;
              auVar75._0_8_ =
                   *(ulong *)((long)scales.data +
                             (long)*(int *)((long)pvVar31 + uVar44 * 4) * 8 +
                             (long)(*(int *)(&this->field_0xe4 + (long)p_Var21) * iVar36 * 8) +
                             (long)scales.w * (long)iVar46 *
                             (long)*(int *)(&this->field_0xe8 + (long)p_Var21) * scales.elemsize);
              auVar130 = vpcmpgtb_avx((undefined1  [16])0x0,auVar75);
              auVar162 = vpunpcklbw_avx(auVar75,auVar130);
              auVar82._8_8_ = 0;
              auVar82._0_8_ = *(ulong *)((long)pvVar52 + uVar44 * 8 + (long)local_288);
              auVar130 = vpcmpgtb_avx((undefined1  [16])0x0,auVar82);
              auVar130 = vpunpcklbw_avx(auVar82,auVar130);
              auVar111 = vpmullw_avx(auVar130,auVar162);
              auVar130 = vpmulhw_avx(auVar162,auVar130);
              auVar162 = vpunpcklwd_avx(auVar111,auVar130);
              auVar111 = vpunpckhwd_avx(auVar111,auVar130);
              auVar130 = vpaddd_avx(auVar74._0_16_,auVar162);
              auVar74 = ZEXT1664(auVar130);
              auVar130 = vpaddd_avx(auVar66._0_16_,auVar111);
              auVar66 = ZEXT1664(auVar130);
              uVar44 = uVar44 + 1;
            }
            auVar130 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1f8 + (long)p_Var21) + uVar24 * 0x20);
            auVar111 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1f8 + (long)p_Var21) + 0x10 + uVar24 * 0x20);
            pfVar45 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var21) + uVar24 * 0x20);
            auVar106._0_4_ = auVar130._0_4_ * *pfVar45;
            auVar106._4_4_ = auVar130._4_4_ * pfVar45[1];
            auVar106._8_4_ = auVar130._8_4_ * pfVar45[2];
            auVar106._12_4_ = auVar130._12_4_ * pfVar45[3];
            pfVar45 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var21) + 0x10 + uVar24 * 0x20
                               );
            auVar122._0_4_ = auVar111._0_4_ * *pfVar45;
            auVar122._4_4_ = auVar111._4_4_ * pfVar45[1];
            auVar122._8_4_ = auVar111._8_4_ * pfVar45[2];
            auVar122._12_4_ = auVar111._12_4_ * pfVar45[3];
            auVar162 = vrcpps_avx(auVar106);
            auVar138 = vrcpps_avx(auVar122);
            auVar130 = vcmpps_avx(auVar130,ZEXT816(0) << 0x40,4);
            auVar130 = vandps_avx(auVar130,auVar162);
            auVar111 = vcmpps_avx(auVar111,ZEXT816(0) << 0x40,4);
            auVar111 = vandps_avx(auVar111,auVar138);
            auVar162 = vcvtdq2ps_avx(auVar74._0_16_);
            auVar67._0_4_ = auVar130._0_4_ * auVar162._0_4_;
            auVar67._4_4_ = auVar130._4_4_ * auVar162._4_4_;
            auVar67._8_4_ = auVar130._8_4_ * auVar162._8_4_;
            auVar67._12_4_ = auVar130._12_4_ * auVar162._12_4_;
            auVar130 = vcvtdq2ps_avx(auVar66._0_16_);
            auVar57._0_4_ = auVar111._0_4_ * auVar130._0_4_;
            auVar57._4_4_ = auVar111._4_4_ * auVar130._4_4_;
            auVar57._8_4_ = auVar111._8_4_ * auVar130._8_4_;
            auVar57._12_4_ = auVar111._12_4_ * auVar130._12_4_;
            if (*(int *)(&this->field_0x100 + (long)p_Var21) != 0) {
              pfVar45 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var21) + uVar24 * 0x20);
              auVar67._0_4_ = auVar67._0_4_ + *pfVar45;
              auVar67._4_4_ = auVar67._4_4_ + pfVar45[1];
              auVar67._8_4_ = auVar67._8_4_ + pfVar45[2];
              auVar67._12_4_ = auVar67._12_4_ + pfVar45[3];
              pfVar45 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var21) + 0x10 +
                                 uVar24 * 0x20);
              auVar57._0_4_ = auVar57._0_4_ + *pfVar45;
              auVar57._4_4_ = auVar57._4_4_ + pfVar45[1];
              auVar57._8_4_ = auVar57._8_4_ + pfVar45[2];
              auVar57._12_4_ = auVar57._12_4_ + pfVar45[3];
            }
            auVar79 = auVar67;
            auVar105 = auVar57;
            if (*(int *)(&this->field_0x110 + (long)p_Var21) - 1U < 6) {
              auVar130 = ZEXT816(0) << 0x40;
              auVar79 = vmaxps_avx(auVar130,auVar67);
              auVar105 = vmaxps_avx(auVar130,auVar57);
              switch(*(int *)(&this->field_0x110 + (long)p_Var21)) {
              case 2:
                auVar111 = vminps_avx(auVar130,auVar67);
                uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var21);
                auVar107._4_4_ = uVar4;
                auVar107._0_4_ = uVar4;
                auVar107._8_4_ = uVar4;
                auVar107._12_4_ = uVar4;
                auVar79 = vfmadd231ps_fma(auVar79,auVar107,auVar111);
                auVar130 = vminps_avx(auVar130,auVar57);
                auVar105 = vfmadd231ps_fma(auVar105,auVar107,auVar130);
                break;
              case 3:
                uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var21);
                auVar99._4_4_ = uVar4;
                auVar99._0_4_ = uVar4;
                auVar99._8_4_ = uVar4;
                auVar99._12_4_ = uVar4;
                uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var21))[1];
                auVar118._4_4_ = uVar4;
                auVar118._0_4_ = uVar4;
                auVar118._8_4_ = uVar4;
                auVar118._12_4_ = uVar4;
                auVar130 = vmaxps_avx(auVar67,auVar99);
                auVar79 = vminps_avx(auVar130,auVar118);
                auVar130 = vmaxps_avx(auVar57,auVar99);
                auVar105 = vminps_avx(auVar130,auVar118);
                break;
              case 4:
                auVar68._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
                auVar68._8_4_ = -auVar67._8_4_;
                auVar68._12_4_ = -auVar67._12_4_;
                auVar156._8_4_ = 0x42b0c0a5;
                auVar156._0_8_ = 0x42b0c0a542b0c0a5;
                auVar156._12_4_ = 0x42b0c0a5;
                auVar130 = vminps_avx(auVar68,auVar156);
                auVar163._8_4_ = 0xc2b0c0a5;
                auVar163._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar163._12_4_ = 0xc2b0c0a5;
                auVar162 = vmaxps_avx(auVar163,auVar130);
                auVar167._8_4_ = 0x3fb8aa3b;
                auVar167._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar167._12_4_ = 0x3fb8aa3b;
                auVar169._8_4_ = 0x3f000000;
                auVar169._0_8_ = 0x3f0000003f000000;
                auVar169._12_4_ = 0x3f000000;
                auVar130 = vfmadd213ps_fma(auVar167,auVar162,auVar169);
                auVar100._0_4_ = (int)auVar130._0_4_;
                auVar100._4_4_ = (int)auVar130._4_4_;
                auVar100._8_4_ = (int)auVar130._8_4_;
                auVar100._12_4_ = (int)auVar130._12_4_;
                auVar111 = vcvtdq2ps_avx(auVar100);
                auVar130 = vcmpps_avx(auVar130,auVar111,1);
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar130 = vandps_avx(auVar171,auVar130);
                auVar138 = vsubps_avx(auVar111,auVar130);
                auVar174._8_4_ = 0x3f317218;
                auVar174._0_8_ = 0x3f3172183f317218;
                auVar174._12_4_ = 0x3f317218;
                auVar111 = vfnmadd231ps_fma(auVar162,auVar138,auVar174);
                fVar55 = auVar111._0_4_;
                auVar119._0_4_ = fVar55 * fVar55;
                fVar54 = auVar111._4_4_;
                auVar119._4_4_ = fVar54 * fVar54;
                fVar7 = auVar111._8_4_;
                auVar119._8_4_ = fVar7 * fVar7;
                fVar6 = auVar111._12_4_;
                auVar119._12_4_ = fVar6 * fVar6;
                auVar178._8_4_ = 0x39506967;
                auVar178._0_8_ = 0x3950696739506967;
                auVar178._12_4_ = 0x39506967;
                auVar190._8_4_ = 0x3ab743ce;
                auVar190._0_8_ = 0x3ab743ce3ab743ce;
                auVar190._12_4_ = 0x3ab743ce;
                auVar130 = vfmadd213ps_fma(auVar178,auVar111,auVar190);
                auVar192._8_4_ = 0x3c088908;
                auVar192._0_8_ = 0x3c0889083c088908;
                auVar192._12_4_ = 0x3c088908;
                auVar130 = vfmadd213ps_fma(auVar130,auVar111,auVar192);
                auVar101._8_4_ = 0x3d2aa9c1;
                auVar101._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar101._12_4_ = 0x3d2aa9c1;
                auVar130 = vfmadd213ps_fma(auVar130,auVar111,auVar101);
                auVar102._8_4_ = 0x3e2aaaaa;
                auVar102._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar102._12_4_ = 0x3e2aaaaa;
                auVar130 = vfmadd213ps_fma(auVar130,auVar111,auVar102);
                auVar130 = vfmadd213ps_fma(auVar130,auVar111,auVar169);
                auVar103._0_4_ = fVar55 + 1.0;
                auVar103._4_4_ = fVar54 + 1.0;
                auVar103._8_4_ = fVar7 + 1.0;
                auVar103._12_4_ = fVar6 + 1.0;
                auVar3 = vfmadd231ps_fma(auVar103,auVar119,auVar130);
                auVar58._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
                auVar58._8_4_ = -auVar57._8_4_;
                auVar58._12_4_ = -auVar57._12_4_;
                auVar130 = vminps_avx(auVar58,auVar156);
                auVar162 = vmaxps_avx(auVar163,auVar130);
                auVar130 = vfmadd213ps_fma(auVar167,auVar162,auVar169);
                auVar120._0_4_ = (int)auVar130._0_4_;
                auVar120._4_4_ = (int)auVar130._4_4_;
                auVar120._8_4_ = (int)auVar130._8_4_;
                auVar120._12_4_ = (int)auVar130._12_4_;
                auVar111 = vcvtdq2ps_avx(auVar120);
                auVar130 = vcmpps_avx(auVar130,auVar111,1);
                auVar130 = vandps_avx(auVar171,auVar130);
                auVar111 = vsubps_avx(auVar111,auVar130);
                auVar162 = vfnmadd231ps_fma(auVar162,auVar111,auVar174);
                fVar55 = auVar162._0_4_;
                auVar78._0_4_ = fVar55 * fVar55;
                fVar54 = auVar162._4_4_;
                auVar78._4_4_ = fVar54 * fVar54;
                fVar7 = auVar162._8_4_;
                auVar78._8_4_ = fVar7 * fVar7;
                fVar6 = auVar162._12_4_;
                auVar78._12_4_ = fVar6 * fVar6;
                auVar130 = vfmadd213ps_fma(auVar178,auVar162,auVar190);
                auVar130 = vfmadd213ps_fma(auVar130,auVar162,auVar192);
                auVar146._8_4_ = 0x3d2aa9c1;
                auVar146._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar146._12_4_ = 0x3d2aa9c1;
                auVar130 = vfmadd213ps_fma(auVar130,auVar162,auVar146);
                auVar147._8_4_ = 0x3e2aaaaa;
                auVar147._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar147._12_4_ = 0x3e2aaaaa;
                auVar130 = vfmadd213ps_fma(auVar130,auVar162,auVar147);
                auVar130 = vfmadd213ps_fma(auVar130,auVar162,auVar169);
                auVar59._0_4_ = fVar55 + 1.0;
                auVar59._4_4_ = fVar54 + 1.0;
                auVar59._8_4_ = fVar7 + 1.0;
                auVar59._12_4_ = fVar6 + 1.0;
                auVar65 = vfmadd231ps_fma(auVar59,auVar78,auVar130);
                auVar69._0_4_ = (int)auVar138._0_4_;
                auVar69._4_4_ = (int)auVar138._4_4_;
                auVar69._8_4_ = (int)auVar138._8_4_;
                auVar69._12_4_ = (int)auVar138._12_4_;
                auVar130 = vpslld_avx(auVar69,0x17);
                auVar132._8_4_ = 0x3f800000;
                auVar132._0_8_ = 0x3f8000003f800000;
                auVar132._12_4_ = 0x3f800000;
                auVar130 = vpaddd_avx(auVar130,auVar132);
                auVar162 = vfmadd213ps_fma(auVar130,auVar3,auVar171);
                auVar130 = vrcpps_avx(auVar162);
                auVar162 = vfmsub213ps_fma(auVar162,auVar130,auVar171);
                auVar79 = vfnmadd132ps_fma(auVar162,auVar130,auVar130);
                auVar70._0_4_ = (int)auVar111._0_4_;
                auVar70._4_4_ = (int)auVar111._4_4_;
                auVar70._8_4_ = (int)auVar111._8_4_;
                auVar70._12_4_ = (int)auVar111._12_4_;
                auVar130 = vpslld_avx(auVar70,0x17);
                auVar130 = vpaddd_avx(auVar130,auVar132);
                auVar111 = vfmadd213ps_fma(auVar130,auVar65,auVar171);
                auVar130 = vrcpps_avx(auVar111);
                auVar111 = vfmsub213ps_fma(auVar111,auVar130,auVar171);
                auVar105 = vfnmadd132ps_fma(auVar111,auVar130,auVar130);
                break;
              case 5:
                auVar172._8_4_ = 0x42b0c0a5;
                auVar172._0_8_ = 0x42b0c0a542b0c0a5;
                auVar172._12_4_ = 0x42b0c0a5;
                auVar111 = vminps_avx(auVar172,auVar67);
                auVar175._8_4_ = 0xc2b0c0a5;
                auVar175._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar175._12_4_ = 0xc2b0c0a5;
                auVar138 = vmaxps_avx(auVar175,auVar111);
                auVar179._8_4_ = 0x3fb8aa3b;
                auVar179._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar179._12_4_ = 0x3fb8aa3b;
                auVar191._8_4_ = 0x3f000000;
                auVar191._0_8_ = 0x3f0000003f000000;
                auVar191._12_4_ = 0x3f000000;
                auVar111 = vfmadd213ps_fma(auVar179,auVar138,auVar191);
                auVar108._0_4_ = (int)auVar111._0_4_;
                auVar108._4_4_ = (int)auVar111._4_4_;
                auVar108._8_4_ = (int)auVar111._8_4_;
                auVar108._12_4_ = (int)auVar111._12_4_;
                auVar162 = vcvtdq2ps_avx(auVar108);
                auVar111 = vcmpps_avx(auVar111,auVar162,1);
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = 0x3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar111 = vandps_avx(auVar170,auVar111);
                auVar111 = vsubps_avx(auVar162,auVar111);
                auVar176._8_4_ = 0x3f317218;
                auVar176._0_8_ = 0x3f3172183f317218;
                auVar176._12_4_ = 0x3f317218;
                auVar138 = vfnmadd231ps_fma(auVar138,auVar111,auVar176);
                fVar55 = auVar138._0_4_;
                auVar109._0_4_ = fVar55 * fVar55;
                fVar54 = auVar138._4_4_;
                auVar109._4_4_ = fVar54 * fVar54;
                fVar7 = auVar138._8_4_;
                auVar109._8_4_ = fVar7 * fVar7;
                fVar6 = auVar138._12_4_;
                auVar109._12_4_ = fVar6 * fVar6;
                auVar123._8_4_ = 0x39506967;
                auVar123._0_8_ = 0x3950696739506967;
                auVar123._12_4_ = 0x39506967;
                auVar134._8_4_ = 0x3ab743ce;
                auVar134._0_8_ = 0x3ab743ce3ab743ce;
                auVar134._12_4_ = 0x3ab743ce;
                auVar162 = vfmadd213ps_fma(auVar123,auVar138,auVar134);
                auVar135._8_4_ = 0x3c088908;
                auVar135._0_8_ = 0x3c0889083c088908;
                auVar135._12_4_ = 0x3c088908;
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar135);
                auVar136._8_4_ = 0x3d2aa9c1;
                auVar136._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar136._12_4_ = 0x3d2aa9c1;
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar136);
                auVar137._8_4_ = 0x3e2aaaaa;
                auVar137._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar137._12_4_ = 0x3e2aaaaa;
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar137);
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar191);
                auVar76._0_4_ = fVar55 + 1.0;
                auVar76._4_4_ = fVar54 + 1.0;
                auVar76._8_4_ = fVar7 + 1.0;
                auVar76._12_4_ = fVar6 + 1.0;
                auVar162 = vfmadd231ps_fma(auVar76,auVar109,auVar162);
                auVar110._0_4_ = (int)auVar111._0_4_;
                auVar110._4_4_ = (int)auVar111._4_4_;
                auVar110._8_4_ = (int)auVar111._8_4_;
                auVar110._12_4_ = (int)auVar111._12_4_;
                auVar83._8_4_ = 0x3f800000;
                auVar83._0_8_ = 0x3f8000003f800000;
                auVar83._12_4_ = 0x3f800000;
                auVar111 = vpslld_avx(auVar110,0x17);
                auVar111 = vpaddd_avx(auVar111,auVar83);
                auVar111 = vfmadd213ps_fma(auVar111,auVar162,auVar170);
                auVar162 = vcmpps_avx(auVar111,auVar130,2);
                auVar124._8_4_ = 0x800000;
                auVar124._0_8_ = 0x80000000800000;
                auVar124._12_4_ = 0x800000;
                auVar111 = vmaxps_avx(auVar111,auVar124);
                auVar138 = vpsrld_avx(auVar111,0x17);
                auVar84._8_4_ = 0x807fffff;
                auVar84._0_8_ = 0x807fffff807fffff;
                auVar84._12_4_ = 0x807fffff;
                auVar111 = vandps_avx(auVar111,auVar84);
                auVar11._8_4_ = 0x3f000000;
                auVar11._0_8_ = 0x3f0000003f000000;
                auVar11._12_4_ = 0x3f000000;
                auVar65 = vorps_avx(auVar111,auVar11);
                auVar85._8_4_ = 0xffffff82;
                auVar85._0_8_ = 0xffffff82ffffff82;
                auVar85._12_4_ = 0xffffff82;
                auVar111 = vpaddd_avx(auVar138,auVar85);
                auVar3 = vcvtdq2ps_avx(auVar111);
                auVar157._8_4_ = 0x3f3504f3;
                auVar157._0_8_ = 0x3f3504f33f3504f3;
                auVar157._12_4_ = 0x3f3504f3;
                auVar138 = vcmpps_avx(auVar65,auVar157,1);
                auVar111 = vandps_avx(auVar138,auVar65);
                auVar148._0_4_ = auVar111._0_4_ + auVar65._0_4_ + -1.0;
                auVar148._4_4_ = auVar111._4_4_ + auVar65._4_4_ + -1.0;
                auVar148._8_4_ = auVar111._8_4_ + auVar65._8_4_ + -1.0;
                auVar148._12_4_ = auVar111._12_4_ + auVar65._12_4_ + -1.0;
                auVar111 = vandps_avx(auVar138,auVar170);
                auVar111 = vsubps_avx(auVar3,auVar111);
                auVar158._0_4_ = auVar148._0_4_ * auVar148._0_4_;
                auVar158._4_4_ = auVar148._4_4_ * auVar148._4_4_;
                auVar158._8_4_ = auVar148._8_4_ * auVar148._8_4_;
                auVar158._12_4_ = auVar148._12_4_ * auVar148._12_4_;
                auVar164._8_4_ = 0x3d9021bb;
                auVar164._0_8_ = 0x3d9021bb3d9021bb;
                auVar164._12_4_ = 0x3d9021bb;
                auVar180._8_4_ = 0xbdebd1b8;
                auVar180._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar180._12_4_ = 0xbdebd1b8;
                auVar138 = vfmadd213ps_fma(auVar164,auVar148,auVar180);
                auVar181._8_4_ = 0x3def251a;
                auVar181._0_8_ = 0x3def251a3def251a;
                auVar181._12_4_ = 0x3def251a;
                auVar138 = vfmadd213ps_fma(auVar138,auVar148,auVar181);
                auVar182._8_4_ = 0xbdfe5d4f;
                auVar182._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar182._12_4_ = 0xbdfe5d4f;
                auVar138 = vfmadd213ps_fma(auVar138,auVar148,auVar182);
                auVar183._8_4_ = 0x3e11e9bf;
                auVar183._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar183._12_4_ = 0x3e11e9bf;
                auVar138 = vfmadd213ps_fma(auVar138,auVar148,auVar183);
                auVar184._8_4_ = 0xbe2aae50;
                auVar184._0_8_ = 0xbe2aae50be2aae50;
                auVar184._12_4_ = 0xbe2aae50;
                auVar138 = vfmadd213ps_fma(auVar138,auVar148,auVar184);
                auVar185._8_4_ = 0x3e4cceac;
                auVar185._0_8_ = 0x3e4cceac3e4cceac;
                auVar185._12_4_ = 0x3e4cceac;
                auVar138 = vfmadd213ps_fma(auVar138,auVar148,auVar185);
                auVar186._8_4_ = 0xbe7ffffc;
                auVar186._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar186._12_4_ = 0xbe7ffffc;
                auVar138 = vfmadd213ps_fma(auVar138,auVar148,auVar186);
                auVar187._8_4_ = 0x3eaaaaaa;
                auVar187._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar187._12_4_ = 0x3eaaaaaa;
                auVar138 = vfmadd213ps_fma(auVar138,auVar148,auVar187);
                auVar138 = vfmsub213ps_fma(auVar138,auVar148,auVar191);
                auVar111 = vfmadd213ps_fma(auVar111,auVar176,auVar148);
                auVar111 = vfmadd231ps_fma(auVar111,auVar158,auVar138);
                auVar139._0_4_ = auVar111._0_4_ * -2.0;
                auVar139._4_4_ = auVar111._4_4_ * -2.0;
                auVar139._8_4_ = auVar111._8_4_ * -2.0;
                auVar139._12_4_ = auVar111._12_4_ * -2.0;
                auVar149._8_4_ = 0x7fffffff;
                auVar149._0_8_ = 0x7fffffff7fffffff;
                auVar149._12_4_ = 0x7fffffff;
                auVar111 = vblendvps_avx(auVar139,auVar149,auVar162);
                auVar86._8_4_ = 0x42b0c0a5;
                auVar86._0_8_ = 0x42b0c0a542b0c0a5;
                auVar86._12_4_ = 0x42b0c0a5;
                auVar111 = vminps_avx(auVar111,auVar86);
                auVar125._8_4_ = 0xc2b0c0a5;
                auVar125._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar125._12_4_ = 0xc2b0c0a5;
                auVar138 = vmaxps_avx(auVar111,auVar125);
                auVar111 = vfmadd213ps_fma(auVar179,auVar138,auVar191);
                auVar150._0_4_ = (int)auVar111._0_4_;
                auVar150._4_4_ = (int)auVar111._4_4_;
                auVar150._8_4_ = (int)auVar111._8_4_;
                auVar150._12_4_ = (int)auVar111._12_4_;
                auVar162 = vcvtdq2ps_avx(auVar150);
                auVar111 = vcmpps_avx(auVar111,auVar162,1);
                auVar111 = vandps_avx(auVar170,auVar111);
                auVar111 = vsubps_avx(auVar162,auVar111);
                auVar138 = vfnmadd231ps_fma(auVar138,auVar111,auVar176);
                fVar55 = auVar138._0_4_;
                auVar151._0_4_ = fVar55 * fVar55;
                fVar54 = auVar138._4_4_;
                auVar151._4_4_ = fVar54 * fVar54;
                fVar7 = auVar138._8_4_;
                auVar151._8_4_ = fVar7 * fVar7;
                fVar6 = auVar138._12_4_;
                auVar151._12_4_ = fVar6 * fVar6;
                auVar112._8_4_ = 0x39506967;
                auVar112._0_8_ = 0x3950696739506967;
                auVar112._12_4_ = 0x39506967;
                auVar173._8_4_ = 0x3ab743ce;
                auVar173._0_8_ = 0x3ab743ce3ab743ce;
                auVar173._12_4_ = 0x3ab743ce;
                auVar162 = vfmadd213ps_fma(auVar112,auVar138,auVar173);
                auVar177._8_4_ = 0x3c088908;
                auVar177._0_8_ = 0x3c0889083c088908;
                auVar177._12_4_ = 0x3c088908;
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar177);
                auVar188._8_4_ = 0x3d2aa9c1;
                auVar188._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar188._12_4_ = 0x3d2aa9c1;
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar188);
                auVar165._8_4_ = 0x3e2aaaaa;
                auVar165._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar165._12_4_ = 0x3e2aaaaa;
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar165);
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar191);
                auVar166._0_4_ = fVar55 + 1.0;
                auVar166._4_4_ = fVar54 + 1.0;
                auVar166._8_4_ = fVar7 + 1.0;
                auVar166._12_4_ = fVar6 + 1.0;
                auVar162 = vfmadd231ps_fma(auVar166,auVar151,auVar162);
                auVar77._0_4_ = (int)auVar111._0_4_;
                auVar77._4_4_ = (int)auVar111._4_4_;
                auVar77._8_4_ = (int)auVar111._8_4_;
                auVar77._12_4_ = (int)auVar111._12_4_;
                auVar111 = vpslld_avx(auVar77,0x17);
                auVar111 = vpaddd_avx(auVar111,auVar83);
                auVar162 = vfmadd213ps_fma(auVar111,auVar162,auVar170);
                auVar111 = vrcpps_avx(auVar162);
                auVar152._0_4_ = auVar111._0_4_ + auVar111._0_4_;
                auVar152._4_4_ = auVar111._4_4_ + auVar111._4_4_;
                auVar152._8_4_ = auVar111._8_4_ + auVar111._8_4_;
                auVar152._12_4_ = auVar111._12_4_ + auVar111._12_4_;
                auVar159._8_4_ = 0x40000000;
                auVar159._0_8_ = 0x4000000040000000;
                auVar159._12_4_ = 0x40000000;
                auVar162 = vfmsub213ps_fma(auVar162,auVar152,auVar159);
                auVar8 = vfnmadd213ps_fma(auVar162,auVar111,auVar152);
                auVar140._8_4_ = 0x42b0c0a5;
                auVar140._0_8_ = 0x42b0c0a542b0c0a5;
                auVar140._12_4_ = 0x42b0c0a5;
                auVar111 = vminps_avx(auVar57,auVar140);
                auVar138 = vmaxps_avx(auVar111,auVar125);
                auVar153._8_4_ = 0x3fb8aa3b;
                auVar153._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar153._12_4_ = 0x3fb8aa3b;
                auVar111 = vfmadd213ps_fma(auVar153,auVar138,auVar191);
                auVar160._0_4_ = (int)auVar111._0_4_;
                auVar160._4_4_ = (int)auVar111._4_4_;
                auVar160._8_4_ = (int)auVar111._8_4_;
                auVar160._12_4_ = (int)auVar111._12_4_;
                auVar162 = vcvtdq2ps_avx(auVar160);
                auVar111 = vcmpps_avx(auVar111,auVar162,1);
                auVar111 = vandps_avx(auVar170,auVar111);
                auVar111 = vsubps_avx(auVar162,auVar111);
                auVar126._8_4_ = 0x3f317218;
                auVar126._0_8_ = 0x3f3172183f317218;
                auVar126._12_4_ = 0x3f317218;
                auVar138 = vfnmadd231ps_fma(auVar138,auVar111,auVar126);
                fVar55 = auVar138._0_4_;
                auVar161._0_4_ = fVar55 * fVar55;
                fVar54 = auVar138._4_4_;
                auVar161._4_4_ = fVar54 * fVar54;
                fVar7 = auVar138._8_4_;
                auVar161._8_4_ = fVar7 * fVar7;
                fVar6 = auVar138._12_4_;
                auVar161._12_4_ = fVar6 * fVar6;
                auVar162 = vfmadd213ps_fma(auVar112,auVar138,auVar173);
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar177);
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar188);
                auVar189._8_4_ = 0x3e2aaaaa;
                auVar189._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar189._12_4_ = 0x3e2aaaaa;
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar189);
                auVar162 = vfmadd213ps_fma(auVar162,auVar138,auVar191);
                auVar141._0_4_ = fVar55 + 1.0;
                auVar141._4_4_ = fVar54 + 1.0;
                auVar141._8_4_ = fVar7 + 1.0;
                auVar141._12_4_ = fVar6 + 1.0;
                auVar162 = vfmadd231ps_fma(auVar141,auVar161,auVar162);
                auVar154._0_4_ = (int)auVar111._0_4_;
                auVar154._4_4_ = (int)auVar111._4_4_;
                auVar154._8_4_ = (int)auVar111._8_4_;
                auVar154._12_4_ = (int)auVar111._12_4_;
                auVar111 = vpslld_avx(auVar154,0x17);
                auVar111 = vpaddd_avx(auVar111,auVar83);
                auVar65 = vfmadd213ps_fma(auVar111,auVar162,auVar170);
                auVar113._8_4_ = 0x800000;
                auVar113._0_8_ = 0x80000000800000;
                auVar113._12_4_ = 0x800000;
                auVar111 = vmaxps_avx(auVar65,auVar113);
                auVar162 = vpsrld_avx(auVar111,0x17);
                auVar111 = vandps_avx(auVar111,auVar84);
                auVar12._8_4_ = 0x3f000000;
                auVar12._0_8_ = 0x3f0000003f000000;
                auVar12._12_4_ = 0x3f000000;
                auVar138 = vorps_avx(auVar111,auVar12);
                auVar3 = vpaddd_avx(auVar162,auVar85);
                auVar87._8_4_ = 0x3f3504f3;
                auVar87._0_8_ = 0x3f3504f33f3504f3;
                auVar87._12_4_ = 0x3f3504f3;
                auVar162 = vcmpps_avx(auVar138,auVar87,1);
                auVar111 = vandps_avx(auVar162,auVar138);
                auVar114._0_4_ = auVar111._0_4_ + auVar138._0_4_ + -1.0;
                auVar114._4_4_ = auVar111._4_4_ + auVar138._4_4_ + -1.0;
                auVar114._8_4_ = auVar111._8_4_ + auVar138._8_4_ + -1.0;
                auVar114._12_4_ = auVar111._12_4_ + auVar138._12_4_ + -1.0;
                auVar111 = vcmpps_avx(auVar65,auVar130,2);
                auVar138 = vcvtdq2ps_avx(auVar3);
                auVar130 = vandps_avx(auVar170,auVar162);
                auVar130 = vsubps_avx(auVar138,auVar130);
                auVar142._8_4_ = 0x3d9021bb;
                auVar142._0_8_ = 0x3d9021bb3d9021bb;
                auVar142._12_4_ = 0x3d9021bb;
                auVar88._8_4_ = 0xbdebd1b8;
                auVar88._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar88._12_4_ = 0xbdebd1b8;
                auVar162 = vfmadd213ps_fma(auVar142,auVar114,auVar88);
                auVar89._8_4_ = 0x3def251a;
                auVar89._0_8_ = 0x3def251a3def251a;
                auVar89._12_4_ = 0x3def251a;
                auVar162 = vfmadd213ps_fma(auVar162,auVar114,auVar89);
                auVar90._8_4_ = 0xbdfe5d4f;
                auVar90._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar90._12_4_ = 0xbdfe5d4f;
                auVar162 = vfmadd213ps_fma(auVar162,auVar114,auVar90);
                auVar91._8_4_ = 0x3e11e9bf;
                auVar91._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar91._12_4_ = 0x3e11e9bf;
                auVar162 = vfmadd213ps_fma(auVar162,auVar114,auVar91);
                auVar92._8_4_ = 0xbe2aae50;
                auVar92._0_8_ = 0xbe2aae50be2aae50;
                auVar92._12_4_ = 0xbe2aae50;
                auVar162 = vfmadd213ps_fma(auVar162,auVar114,auVar92);
                auVar93._8_4_ = 0x3e4cceac;
                auVar93._0_8_ = 0x3e4cceac3e4cceac;
                auVar93._12_4_ = 0x3e4cceac;
                auVar162 = vfmadd213ps_fma(auVar162,auVar114,auVar93);
                auVar94._8_4_ = 0xbe7ffffc;
                auVar94._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar94._12_4_ = 0xbe7ffffc;
                auVar162 = vfmadd213ps_fma(auVar162,auVar114,auVar94);
                auVar95._8_4_ = 0x3eaaaaaa;
                auVar95._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar95._12_4_ = 0x3eaaaaaa;
                auVar162 = vfmadd213ps_fma(auVar162,auVar114,auVar95);
                auVar162 = vfmsub213ps_fma(auVar162,auVar114,auVar191);
                auVar168._8_4_ = 0x3f317218;
                auVar168._0_8_ = 0x3f3172183f317218;
                auVar168._12_4_ = 0x3f317218;
                auVar130 = vfmadd213ps_fma(auVar130,auVar168,auVar114);
                auVar115._0_4_ = auVar114._0_4_ * auVar114._0_4_;
                auVar115._4_4_ = auVar114._4_4_ * auVar114._4_4_;
                auVar115._8_4_ = auVar114._8_4_ * auVar114._8_4_;
                auVar115._12_4_ = auVar114._12_4_ * auVar114._12_4_;
                auVar130 = vfmadd231ps_fma(auVar130,auVar115,auVar162);
                auVar116._0_4_ = auVar130._0_4_ * -2.0;
                auVar116._4_4_ = auVar130._4_4_ * -2.0;
                auVar116._8_4_ = auVar130._8_4_ * -2.0;
                auVar116._12_4_ = auVar130._12_4_ * -2.0;
                auVar127._8_4_ = 0x7fffffff;
                auVar127._0_8_ = 0x7fffffff7fffffff;
                auVar127._12_4_ = 0x7fffffff;
                auVar130 = vblendvps_avx(auVar116,auVar127,auVar111);
                auVar96._8_4_ = 0x42b0c0a5;
                auVar96._0_8_ = 0x42b0c0a542b0c0a5;
                auVar96._12_4_ = 0x42b0c0a5;
                auVar130 = vminps_avx(auVar130,auVar96);
                auVar97._8_4_ = 0xc2b0c0a5;
                auVar97._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar97._12_4_ = 0xc2b0c0a5;
                auVar162 = vmaxps_avx(auVar130,auVar97);
                auVar128._8_4_ = 0x3fb8aa3b;
                auVar128._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar128._12_4_ = 0x3fb8aa3b;
                auVar130 = vfmadd213ps_fma(auVar128,auVar162,auVar191);
                auVar143._0_4_ = (int)auVar130._0_4_;
                auVar143._4_4_ = (int)auVar130._4_4_;
                auVar143._8_4_ = (int)auVar130._8_4_;
                auVar143._12_4_ = (int)auVar130._12_4_;
                auVar111 = vcvtdq2ps_avx(auVar143);
                auVar130 = vcmpps_avx(auVar130,auVar111,1);
                auVar130 = vandps_avx(auVar170,auVar130);
                auVar130 = vsubps_avx(auVar111,auVar130);
                auVar162 = vfnmadd231ps_fma(auVar162,auVar130,auVar168);
                fVar55 = auVar162._0_4_;
                auVar144._0_4_ = fVar55 * fVar55;
                fVar54 = auVar162._4_4_;
                auVar144._4_4_ = fVar54 * fVar54;
                fVar7 = auVar162._8_4_;
                auVar144._8_4_ = fVar7 * fVar7;
                fVar6 = auVar162._12_4_;
                auVar144._12_4_ = fVar6 * fVar6;
                auVar155._8_4_ = 0x39506967;
                auVar155._0_8_ = 0x3950696739506967;
                auVar155._12_4_ = 0x39506967;
                auVar98._8_4_ = 0x3ab743ce;
                auVar98._0_8_ = 0x3ab743ce3ab743ce;
                auVar98._12_4_ = 0x3ab743ce;
                auVar111 = vfmadd213ps_fma(auVar155,auVar162,auVar98);
                auVar111 = vfmadd213ps_fma(auVar111,auVar162,auVar177);
                auVar111 = vfmadd213ps_fma(auVar111,auVar162,auVar188);
                auVar111 = vfmadd213ps_fma(auVar111,auVar162,auVar189);
                auVar111 = vfmadd213ps_fma(auVar111,auVar162,auVar191);
                auVar117._0_4_ = fVar55 + 1.0;
                auVar117._4_4_ = fVar54 + 1.0;
                auVar117._8_4_ = fVar7 + 1.0;
                auVar117._12_4_ = fVar6 + 1.0;
                auVar111 = vfmadd231ps_fma(auVar117,auVar144,auVar111);
                auVar129._0_4_ = (int)auVar130._0_4_;
                auVar129._4_4_ = (int)auVar130._4_4_;
                auVar129._8_4_ = (int)auVar130._8_4_;
                auVar129._12_4_ = (int)auVar130._12_4_;
                auVar130 = vpslld_avx(auVar129,0x17);
                auVar130 = vpaddd_avx(auVar83,auVar130);
                auVar111 = vfmadd213ps_fma(auVar130,auVar111,auVar170);
                auVar130 = vrcpps_avx(auVar111);
                auVar131._0_4_ = auVar130._0_4_ + auVar130._0_4_;
                auVar131._4_4_ = auVar130._4_4_ + auVar130._4_4_;
                auVar131._8_4_ = auVar130._8_4_ + auVar130._8_4_;
                auVar131._12_4_ = auVar130._12_4_ + auVar130._12_4_;
                auVar145._8_4_ = 0x40000000;
                auVar145._0_8_ = 0x4000000040000000;
                auVar145._12_4_ = 0x40000000;
                auVar111 = vfmsub213ps_fma(auVar111,auVar131,auVar145);
                auVar130 = vfnmadd213ps_fma(auVar111,auVar130,auVar131);
                auVar79 = vfmsub213ps_fma(auVar8,auVar67,auVar67);
                auVar105 = vfmsub213ps_fma(auVar130,auVar57,auVar57);
                break;
              case 6:
                uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var21);
                auVar104._4_4_ = uVar4;
                auVar104._0_4_ = uVar4;
                auVar104._8_4_ = uVar4;
                auVar104._12_4_ = uVar4;
                uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var21))[1];
                auVar121._4_4_ = uVar4;
                auVar121._0_4_ = uVar4;
                auVar121._8_4_ = uVar4;
                auVar121._12_4_ = uVar4;
                auVar111 = vfmadd213ps_fma(auVar67,auVar104,auVar121);
                auVar111 = vmaxps_avx(auVar130,auVar111);
                auVar133._8_4_ = 0x3f800000;
                auVar133._0_8_ = 0x3f8000003f800000;
                auVar133._12_4_ = 0x3f800000;
                auVar111 = vminps_avx(auVar111,auVar133);
                auVar79._0_4_ = auVar111._0_4_ * auVar67._0_4_;
                auVar79._4_4_ = auVar111._4_4_ * auVar67._4_4_;
                auVar79._8_4_ = auVar111._8_4_ * auVar67._8_4_;
                auVar79._12_4_ = auVar111._12_4_ * auVar67._12_4_;
                auVar111 = vfmadd213ps_fma(auVar104,auVar57,auVar121);
                auVar130 = vmaxps_avx(auVar130,auVar111);
                auVar130 = vminps_avx(auVar130,auVar133);
                auVar105._0_4_ = auVar130._0_4_ * auVar57._0_4_;
                auVar105._4_4_ = auVar130._4_4_ * auVar57._4_4_;
                auVar105._8_4_ = auVar130._8_4_ * auVar57._8_4_;
                auVar105._12_4_ = auVar130._12_4_ * auVar57._12_4_;
              }
            }
            if (iVar41 < 0x65) {
              *pauVar34 = auVar79;
              pauVar34[1] = auVar105;
              pauVar34 = pauVar34 + 2;
            }
            else {
              pfVar45 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var21) + uVar24 * 0x20);
              auVar60._0_4_ = auVar79._0_4_ * *pfVar45;
              auVar60._4_4_ = auVar79._4_4_ * pfVar45[1];
              auVar60._8_4_ = auVar79._8_4_ * pfVar45[2];
              auVar60._12_4_ = auVar79._12_4_ * pfVar45[3];
              pfVar45 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var21) + 0x10 +
                                 uVar24 * 0x20);
              auVar71._0_4_ = auVar105._0_4_ * *pfVar45;
              auVar71._4_4_ = auVar105._4_4_ * pfVar45[1];
              auVar71._8_4_ = auVar105._8_4_ * pfVar45[2];
              auVar71._12_4_ = auVar105._12_4_ * pfVar45[3];
              auVar9._8_4_ = 0x80000000;
              auVar9._0_8_ = 0x8000000080000000;
              auVar9._12_4_ = 0x80000000;
              auVar130 = vandps_avx(auVar60,auVar9);
              auVar111 = vandps_avx(auVar71,auVar9);
              auVar13._8_4_ = 0x3f000000;
              auVar13._0_8_ = 0x3f0000003f000000;
              auVar13._12_4_ = 0x3f000000;
              auVar130 = vorps_avx(auVar130,auVar13);
              auVar111 = vorps_avx(auVar111,auVar13);
              auVar61._0_4_ = (int)(auVar60._0_4_ + auVar130._0_4_);
              auVar61._4_4_ = (int)(auVar60._4_4_ + auVar130._4_4_);
              auVar61._8_4_ = (int)(auVar60._8_4_ + auVar130._8_4_);
              auVar61._12_4_ = (int)(auVar60._12_4_ + auVar130._12_4_);
              auVar72._0_4_ = (int)(auVar71._0_4_ + auVar111._0_4_);
              auVar72._4_4_ = (int)(auVar71._4_4_ + auVar111._4_4_);
              auVar72._8_4_ = (int)(auVar71._8_4_ + auVar111._8_4_);
              auVar72._12_4_ = (int)(auVar71._12_4_ + auVar111._12_4_);
              auVar130 = vpackssdw_avx(auVar61,auVar72);
              auVar130 = vpminsw_avx(auVar130,auVar56);
              auVar73._8_2_ = 0xff81;
              auVar73._0_8_ = 0xff81ff81ff81ff81;
              auVar73._10_2_ = 0xff81;
              auVar73._12_2_ = 0xff81;
              auVar73._14_2_ = 0xff81;
              auVar130 = vpmaxsw_avx(auVar130,auVar73);
              auVar130 = vpacksswb_avx(auVar130,auVar130);
              *puVar30 = auVar130._0_8_;
              puVar30 = puVar30 + 1;
            }
          }
        }
        Mat::~Mat(&scales);
        local_288 = local_288 + (int)uVar50 * 8;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&top_blob_unpacked);
    iVar46 = 0;
    goto LAB_002624be;
  }
  sVar47 = (ulong)opt->use_packing_layout * 3 + 1;
  local_308 = 1;
  if ((*(uint *)(&this->field_0xd0 + (long)p_Var21) & 3) != 0) {
    sVar47 = 1;
  }
  uVar43 = (uint)sVar47;
  uVar50 = (ulong)(uVar43 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var21)) {
    uVar50 = sVar47;
  }
  Mat::create(top_blob,iVar32,iVar18,(int)*(uint *)(&this->field_0xd0 + (long)p_Var21) / (int)uVar43
              ,uVar50,uVar43,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002624be;
  uVar29 = (int)uVar29 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  uVar19 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  uVar48 = 1;
  if (opt->use_packing_layout == true) {
    local_308 = 1;
    if ((uVar29 & 7) == 0) {
      local_308 = 8;
    }
    uVar48 = (uint)((uVar19 & 3) == 0) * 3 + 1;
  }
  piVar15 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_)
  ;
  scales.refcount =
       (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  scales.data = bottom_blob_bordered.data;
  scales.elemsize = bottom_blob_bordered.elemsize;
  scales.elempack = bottom_blob_bordered.elempack;
  scales.allocator = bottom_blob_bordered.allocator;
  scales.w = bottom_blob_bordered.w;
  scales.dims = bottom_blob_bordered.dims;
  scales.d = bottom_blob_bordered.d;
  scales.h = bottom_blob_bordered.h;
  scales.c = bottom_blob_bordered.c;
  scales.cstep = bottom_blob_bordered.cstep;
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + 1;
    UNLOCK();
  }
  if (local_308 < iVar36) {
    top_blob_unpacked.data = *(void **)opt;
    top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
    top_blob_unpacked.elempack = opt->openmp_blocktime;
    top_blob_unpacked._28_1_ = opt->use_winograd_convolution;
    top_blob_unpacked._29_1_ = opt->use_sgemm_convolution;
    top_blob_unpacked._30_1_ = opt->use_int8_inference;
    top_blob_unpacked._31_1_ = opt->use_vulkan_compute;
    top_blob_unpacked.allocator._0_1_ = opt->use_bf16_storage;
    top_blob_unpacked.allocator._1_1_ = opt->use_fp16_packed;
    top_blob_unpacked.allocator._2_1_ = opt->use_fp16_storage;
    top_blob_unpacked.allocator._3_1_ = opt->use_fp16_arithmetic;
    top_blob_unpacked.allocator._4_1_ = opt->use_int8_packed;
    top_blob_unpacked.allocator._5_1_ = opt->use_int8_storage;
    top_blob_unpacked.allocator._6_1_ = opt->use_int8_arithmetic;
    top_blob_unpacked.allocator._7_1_ = opt->use_packing_layout;
    top_blob_unpacked.dims._0_1_ = opt->use_shader_pack8;
    top_blob_unpacked.dims._1_1_ = opt->use_subgroup_basic;
    top_blob_unpacked.dims._2_1_ = opt->use_subgroup_vote;
    top_blob_unpacked.dims._3_1_ = opt->use_subgroup_ballot;
    top_blob_unpacked.w._0_1_ = opt->use_subgroup_shuffle;
    top_blob_unpacked.w._1_1_ = opt->use_image_storage;
    top_blob_unpacked.w._2_1_ = opt->use_tensor_storage;
    top_blob_unpacked.w._3_1_ = opt->use_weight_fp16_storage;
    top_blob_unpacked.h = opt->flush_denormals;
    top_blob_unpacked.d._0_1_ = opt->use_local_pool_allocator;
    top_blob_unpacked.d._1_1_ = opt->use_reserved_1;
    top_blob_unpacked.d._2_1_ = opt->use_reserved_2;
    top_blob_unpacked.d._3_1_ = opt->use_reserved_3;
    top_blob_unpacked.c._0_1_ = opt->use_reserved_4;
    top_blob_unpacked.c._1_1_ = opt->use_reserved_5;
    top_blob_unpacked.c._2_1_ = opt->use_reserved_6;
    top_blob_unpacked.c._3_1_ = opt->use_reserved_7;
    top_blob_unpacked._60_1_ = opt->use_reserved_8;
    top_blob_unpacked._61_1_ = opt->use_reserved_9;
    top_blob_unpacked._62_1_ = opt->use_reserved_10;
    top_blob_unpacked._63_1_ = opt->use_reserved_11;
    top_blob_unpacked.refcount = (int *)opt->workspace_allocator;
    convert_packing(&bottom_blob_bordered,&scales,local_308,(Option *)&top_blob_unpacked);
  }
  Mat::Mat(&top_blob_unpacked,top_blob);
  if (uVar48 < uVar43) {
    local_318 = (byte)uVar50;
    Mat::create(&top_blob_unpacked,iVar32,iVar18,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) /
                (int)uVar48,(ulong)((byte)(local_318 / (byte)sVar47) * uVar48),uVar48,
                opt->workspace_allocator);
    iVar46 = -100;
    if ((top_blob_unpacked.data != (void *)0x0) &&
       ((long)top_blob_unpacked.c * top_blob_unpacked.cstep != 0)) goto LAB_0026236f;
  }
  else {
LAB_0026236f:
    iVar36 = 0;
    iVar46 = 0;
    for (lVar49 = 0;
        lVar49 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
        lVar49 = lVar49 + 1) {
      Mat::channel_range((Mat *)&requantize_scales,&scales,iVar36 / local_308,
                         (int)uVar29 / local_308);
      Mat::channel_range(&top_blob_g,&top_blob_unpacked,iVar46 / (int)uVar48,
                         (int)uVar19 / (int)uVar48);
      pLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar49];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_reserved_1 = opt->use_reserved_1;
      opt_g.use_reserved_2 = opt->use_reserved_2;
      opt_g.use_reserved_3 = opt->use_reserved_3;
      opt_g.use_reserved_4 = opt->use_reserved_4;
      opt_g.use_reserved_5 = opt->use_reserved_5;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = top_blob->allocator;
      (*pLVar5->_vptr_Layer[7])(pLVar5,(Mat *)&requantize_scales,&top_blob_g,&opt_g);
      Mat::~Mat(&top_blob_g);
      Mat::~Mat((Mat *)&requantize_scales);
      iVar46 = iVar46 + uVar19;
      iVar36 = iVar36 + uVar29;
    }
    if (uVar48 < uVar43) {
      convert_packing(&top_blob_unpacked,top_blob,uVar43,opt);
    }
    else {
      Mat::operator=(top_blob,&top_blob_unpacked);
    }
    iVar46 = 0;
  }
  Mat::~Mat(&top_blob_unpacked);
  Mat::~Mat(&scales);
LAB_002624be:
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_int8);
  return iVar46;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}